

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O3

int bam_cigar2rlen(int n_cigar,uint32_t *cigar)

{
  int iVar1;
  ulong uVar2;
  
  if (0 < n_cigar) {
    uVar2 = 0;
    iVar1 = 0;
    do {
      iVar1 = iVar1 + (cigar[uVar2] >> 4 &
                      (int)((0x3c1a7U >> ((char)cigar[uVar2] * '\x02' & 0x1fU)) << 0x1e) >> 0x1f);
      uVar2 = uVar2 + 1;
    } while ((uint)n_cigar != uVar2);
    return iVar1;
  }
  return 0;
}

Assistant:

int bam_cigar2rlen(int n_cigar, const uint32_t *cigar)
{
    int k, l;
    for (k = l = 0; k < n_cigar; ++k)
        if (bam_cigar_type(bam_cigar_op(cigar[k]))&2)
            l += bam_cigar_oplen(cigar[k]);
    return l;
}